

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_int64comp0(jit_State *J)

{
  jit_State *J_local;
  TRef local_4;
  
  if (*(long *)(ulong)(J->fold).right.field_1.op12 == 0) {
    local_4 = 4;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LJFOLD(UGE any KINT64)
LJFOLDF(kfold_int64comp0)
{
#if LJ_HASFFI
  if (ir_k64(fright)->u64 == 0)
    return DROPFOLD;
  return NEXTFOLD;
#else
  UNUSED(J); lua_assert(0); return FAILFOLD;
#endif
}